

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

DescriptorProto_ExtensionRange *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::DescriptorProto_ExtensionRange>
          (Arena *arena)

{
  DescriptorProto_ExtensionRange *this;
  
  if (arena == (Arena *)0x0) {
    this = (DescriptorProto_ExtensionRange *)operator_new(0x28);
    (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = (void *)0x0;
    this->_has_bits_ = (uint32  [1])0x0;
    this->_cached_size_ = (atomic<int>)0x0;
    (this->super_Message).super_MessageLite._vptr_MessageLite =
         (_func_int **)&PTR__DescriptorProto_ExtensionRange_003c52a8;
    if (scc_info_DescriptorProto_ExtensionRange_google_2fprotobuf_2fdescriptor_2eproto.base.
        visit_status.super___atomic_base<int>._M_i != 0) {
      internal::InitSCCImpl
                (&scc_info_DescriptorProto_ExtensionRange_google_2fprotobuf_2fdescriptor_2eproto.
                  base);
    }
    this->options_ = (ExtensionRangeOptions *)0x0;
    this->start_ = 0;
    this->end_ = 0;
  }
  else {
    if (arena->hooks_cookie_ != (void *)0x0) {
      OnArenaAllocation(arena,(type_info *)&DescriptorProto_ExtensionRange::typeinfo,0x28);
    }
    this = (DescriptorProto_ExtensionRange *)AllocateAlignedNoHook(arena,0x28);
    DescriptorProto_ExtensionRange::DescriptorProto_ExtensionRange(this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NOINLINE PROTOBUF_NAMESPACE_ID::DescriptorProto_ExtensionRange* Arena::CreateMaybeMessage< PROTOBUF_NAMESPACE_ID::DescriptorProto_ExtensionRange >(Arena* arena) {
  return Arena::CreateMessageInternal< PROTOBUF_NAMESPACE_ID::DescriptorProto_ExtensionRange >(arena);
}